

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-3.c
# Opt level: O0

int CheckerBig2(void)

{
  int iVar1;
  FILE *__stream;
  _Bool local_19;
  _Bool passed;
  FILE *out;
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    testN = testN + 1;
    out._4_4_ = -1;
  }
  else {
    local_19 = Check("None",0x4767,(FILE *)__stream);
    if (local_19) {
      iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
      local_19 = iVar1 == 0;
    }
    fclose(__stream);
    if (local_19 == false) {
      printf("FAILED\n");
      testN = testN + 1;
      out._4_4_ = 1;
    }
    else {
      printf("PASSED\n");
      testN = testN + 1;
      out._4_4_ = 0;
    }
  }
  return out._4_4_;
}

Assistant:

static int CheckerBig2(void) {
    FILE *const out = fopen("out.txt", "r");
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    bool passed = Check("None", 18279, out);
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}